

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O2

void __thiscall Config::readFromConfig(Config *this,Confparse *obvconfig)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  double dVar5;
  
  iVar2 = getDPI();
  if (iVar2 == 0) {
    uVar3 = Confparse::ParseInt(obvconfig,"dpi",100);
    this->dpi = uVar3;
  }
  else {
    uVar3 = this->dpi;
  }
  if ((int)uVar3 < 0x32) {
    iVar2 = 0x32;
  }
  else {
    iVar2 = 400;
    if (uVar3 < 0x191) goto LAB_0014aaa5;
  }
  this->dpi = iVar2;
LAB_0014aaa5:
  iVar2 = Confparse::ParseInt(obvconfig,"windowX",0x44c);
  this->windowX = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,"windowY",700);
  this->windowY = iVar2;
  dVar5 = Confparse::ParseDouble(obvconfig,"fontSize",20.0);
  this->fontSize = dVar5;
  Confparse::ParseStr(obvconfig,"fontName","");
  std::__cxx11::string::assign((char *)&this->fontName);
  dVar5 = Confparse::ParseDouble(obvconfig,"pinSizeThresholdLow",0.0);
  this->pinSizeThresholdLow = (float)dVar5;
  bVar1 = Confparse::ParseBool(obvconfig,"pinShapeSquare",false);
  this->pinShapeSquare = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"pinShapeCircle",true);
  this->pinShapeCircle = bVar1;
  if ((!bVar1) && (this->pinShapeSquare == false)) {
    this->pinShapeSquare = true;
  }
  bVar1 = Confparse::ParseBool(obvconfig,"pinHalo",true);
  this->pinHalo = bVar1;
  dVar5 = Confparse::ParseDouble(obvconfig,"pinHaloDiameter",1.25);
  this->pinHaloDiameter = (float)dVar5;
  dVar5 = Confparse::ParseDouble(obvconfig,"pinHaloThickness",2.0);
  this->pinHaloThickness = (float)dVar5;
  bVar1 = Confparse::ParseBool(obvconfig,"pinSelectMasks",true);
  this->pinSelectMasks = bVar1;
  iVar2 = Confparse::ParseInt(obvconfig,"pinA1threshold",3);
  this->pinA1threshold = iVar2;
  bVar1 = Confparse::ParseBool(obvconfig,"showFPS",false);
  this->showFPS = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"showInfoPanel",true);
  this->showInfoPanel = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"infoPanelSelectPartsOnNet",true);
  this->infoPanelSelectPartsOnNet = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"infoPanelCenterZoomNets",true);
  this->infoPanelCenterZoomNets = bVar1;
  dVar5 = Confparse::ParseDouble(obvconfig,"partZoomScaleOutFactor",3.0);
  this->partZoomScaleOutFactor = (float)dVar5;
  iVar2 = Confparse::ParseInt(obvconfig,"infoPanelWidth",0x15e);
  this->infoPanelWidth = iVar2;
  bVar1 = Confparse::ParseBool(obvconfig,"showPins",true);
  this->showPins = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"showPosition",true);
  this->showPosition = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"showNetWeb",true);
  this->showNetWeb = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"showAnnotations",true);
  this->showAnnotations = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"showBackgroundImage",true);
  this->showBackgroundImage = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"fillParts",true);
  this->fillParts = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"showPartName",true);
  this->showPartName = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"showPinName",true);
  this->showPinName = bVar1;
  bVar1 = Confparse::ParseBool(obvconfig,"centerZoomSearchResults",true);
  this->centerZoomSearchResults = bVar1;
  iVar2 = Confparse::ParseInt(obvconfig,"flipMode",0);
  this->flipMode = iVar2;
  bVar1 = Confparse::ParseBool(obvconfig,"boardFill",true);
  this->boardFill = bVar1;
  iVar2 = Confparse::ParseInt(obvconfig,"boardFillSpacing",3);
  this->boardFillSpacing = iVar2;
  dVar5 = Confparse::ParseDouble(obvconfig,"zoomFactor",0.5);
  this->zoomFactor = (float)dVar5;
  iVar2 = Confparse::ParseInt(obvconfig,"zoomModifier",5);
  this->zoomModifier = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,"panFactor",0x1e);
  this->panFactor = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,"panModifier",5);
  this->panModifier = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,"annotationBoxSize",0xf);
  this->annotationBoxSize = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,"annotationBoxOffset",8);
  this->annotationBoxOffset = iVar2;
  iVar2 = Confparse::ParseInt(obvconfig,"netWebThickness",2);
  this->netWebThickness = iVar2;
  bVar1 = Confparse::ParseBool(obvconfig,"slowCPU",false);
  this->slowCPU = (bool)(this->slowCPU | bVar1);
  pcVar4 = Confparse::ParseStr(obvconfig,"FZKey","");
  SetFZKey(this,pcVar4);
  pcVar4 = Confparse::ParseStr(obvconfig,"CAEKey","");
  SetCAEKey(this,pcVar4);
  return;
}

Assistant:

void Config::readFromConfig(Confparse &obvconfig) {
	// Special test here, in case we've already set the dpi from external
	// such as command line.
	if (getDPI() == 0) dpi = obvconfig.ParseInt("dpi", 100);
	if (dpi < 50) dpi = 50;
	if (dpi > 400) dpi = 400;

	windowX = obvconfig.ParseInt("windowX", 1100);
	windowY = obvconfig.ParseInt("windowY", 700);

	fontSize            = obvconfig.ParseDouble("fontSize", 20);
	fontName            = obvconfig.ParseStr("fontName", "");
	pinSizeThresholdLow = obvconfig.ParseDouble("pinSizeThresholdLow", 0);
	pinShapeSquare      = obvconfig.ParseBool("pinShapeSquare", false);
	pinShapeCircle      = obvconfig.ParseBool("pinShapeCircle", true);

	if ((!pinShapeCircle) && (!pinShapeSquare)) {
		pinShapeSquare = true;
	}


	pinHalo          = obvconfig.ParseBool("pinHalo", true);
	pinHaloDiameter  = obvconfig.ParseDouble("pinHaloDiameter", 1.25);
	pinHaloThickness = obvconfig.ParseDouble("pinHaloThickness", 2.0);
	pinSelectMasks   = obvconfig.ParseBool("pinSelectMasks", true);

	pinA1threshold	  = obvconfig.ParseInt("pinA1threshold", 3);

	showFPS                   = obvconfig.ParseBool("showFPS", false);
	showInfoPanel             = obvconfig.ParseBool("showInfoPanel", true);
	infoPanelSelectPartsOnNet = obvconfig.ParseBool("infoPanelSelectPartsOnNet", true);
	infoPanelCenterZoomNets   = obvconfig.ParseBool("infoPanelCenterZoomNets", true);
	partZoomScaleOutFactor    = obvconfig.ParseDouble("partZoomScaleOutFactor", 3.0f);

	infoPanelWidth            = obvconfig.ParseInt("infoPanelWidth", 350);
	showPins                  = obvconfig.ParseBool("showPins", true);
	showPosition              = obvconfig.ParseBool("showPosition", true);
	showNetWeb                = obvconfig.ParseBool("showNetWeb", true);
	showAnnotations           = obvconfig.ParseBool("showAnnotations", true);
	showBackgroundImage       = obvconfig.ParseBool("showBackgroundImage", true);
	fillParts                 = obvconfig.ParseBool("fillParts", true);
	showPartName              = obvconfig.ParseBool("showPartName", true);
	showPinName               = obvconfig.ParseBool("showPinName", true);
	centerZoomSearchResults = obvconfig.ParseBool("centerZoomSearchResults", true);
	flipMode                  = obvconfig.ParseInt("flipMode", 0);

	boardFill        = obvconfig.ParseBool("boardFill", true);
	boardFillSpacing = obvconfig.ParseInt("boardFillSpacing", 3);

	zoomFactor   = obvconfig.ParseDouble("zoomFactor", 0.5f);
	zoomModifier = obvconfig.ParseInt("zoomModifier", 5);

	panFactor = obvconfig.ParseInt("panFactor", 30);

	panModifier = obvconfig.ParseInt("panModifier", 5);

	annotationBoxSize = obvconfig.ParseInt("annotationBoxSize", 15);

	annotationBoxOffset = obvconfig.ParseInt("annotationBoxOffset", 8);

	netWebThickness = obvconfig.ParseInt("netWebThickness", 2);


#ifdef _WIN32
	pdfSoftwarePath = obvconfig.ParseStr("pdfSoftwarePath", "SumatraPDF.exe");
#endif

	/*
	 * Some machines (Atom etc) don't have enough CPU/GPU
	 * grunt to cope with the large number of AA'd circles
	 * generated on a large dense board like a Macbook Pro
	 * so we have the lowCPU option which will let people
	 * trade good-looks for better FPS
	 *
	 * If we want slowCPU to take impact from a command line
	 * parameter, we need it to be set to false before we
	 * call this.
	 */
	slowCPU |= obvconfig.ParseBool("slowCPU", false);

	/*
	 * The asus .fz and Asrock .cae file formats require a specific key to be decoded.
	 *
	 * This key is supplied in the obv.conf file as a long single line
	 * of comma/space separated 32-bit hex values 0x1234abcd etc.
	 *
	 */
	SetFZKey(obvconfig.ParseStr("FZKey", ""));
	SetCAEKey(obvconfig.ParseStr("CAEKey", ""));
}